

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbintegration.cpp
# Opt level: O1

void __thiscall
QLinuxFbIntegration::QLinuxFbIntegration(QLinuxFbIntegration *this,QStringList *paramList)

{
  int iVar1;
  QPlatformFontDatabase *pQVar2;
  QFbScreen *pQVar3;
  
  *(code **)this = QAnyStringView::equal;
  QObject::QObject((QObject *)&this->super_QPlatformNativeInterface,(QObject *)0x0);
  *(undefined ***)this = &PTR__QLinuxFbIntegration_00155890;
  *(undefined ***)&this->super_QPlatformNativeInterface = &PTR_metaObject_001559d0;
  *(undefined ***)&this->super_QEvdevKeyMapper = &PTR__QLinuxFbIntegration_00155ac0;
  this->m_primaryScreen = (QFbScreen *)0x0;
  pQVar2 = (QPlatformFontDatabase *)operator_new(8);
  *(code **)pQVar2 = QPlatformScreen::currentMode;
  (this->m_fontDb).d = pQVar2;
  this->m_kbdMgr = (QEvdevKeyboardManager *)0x0;
  (this->m_services).d = (QPlatformServices *)0x0;
  (this->m_vtHandler).d = (QFbVtHandler *)0x0;
  iVar1 = qEnvironmentVariableIntValue("QT_QPA_FB_DRM",(bool *)0x0);
  if (iVar1 != 0) {
    pQVar3 = (QFbScreen *)operator_new(0xc0);
    QLinuxFbDrmScreen::QLinuxFbDrmScreen((QLinuxFbDrmScreen *)pQVar3,paramList);
    this->m_primaryScreen = pQVar3;
  }
  if (this->m_primaryScreen == (QFbScreen *)0x0) {
    pQVar3 = (QFbScreen *)operator_new(0x108);
    QLinuxFbScreen::QLinuxFbScreen((QLinuxFbScreen *)pQVar3,paramList);
    this->m_primaryScreen = pQVar3;
  }
  return;
}

Assistant:

QLinuxFbIntegration::QLinuxFbIntegration(const QStringList &paramList)
    : m_primaryScreen(nullptr),
      m_fontDb(new QGenericUnixFontDatabase)
{
#if QT_CONFIG(kms)
    if (qEnvironmentVariableIntValue("QT_QPA_FB_DRM") != 0)
        m_primaryScreen = new QLinuxFbDrmScreen(paramList);
#endif
    if (!m_primaryScreen)
        m_primaryScreen = new QLinuxFbScreen(paramList);
}